

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleIIgs.cpp
# Opt level: O2

void __thiscall Apple::IIgs::ConcreteMachine::~ConcreteMachine(ConcreteMachine *this)

{
  long lVar1;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_00580318;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005803a8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005803c8;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_005803e0;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005803f8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00580428;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00580468;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_00580480;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00580498;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005804d0;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->joysticks_).joysticks_);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
  ::~LowpassBase(&(this->speaker_).
                  super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>_>,_false>
                );
  Outputs::Speaker::CompoundSource<Apple::IIgs::Sound::GLU,_Audio::Toggle>::~CompoundSource
            (&this->mixer_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  lVar1 = 0;
  do {
    Storage::Disk::Drive::~Drive((Drive *)(&this->field_0x14848 + lVar1));
    lVar1 = lVar1 + -0x178;
  } while (lVar1 != -0x2f0);
  lVar1 = 0;
  do {
    Storage::Disk::Drive::~Drive((Drive *)(&this->field_0x14558 + lVar1));
    lVar1 = lVar1 + -0x178;
  } while (lVar1 != -0x2f0);
  JustInTimeActor<Apple::IIgs::ADB::GLU,_Cycles,_1,_4>::~JustInTimeActor(&this->adb_glu_);
  JustInTimeActor<Apple::IIgs::Video::Video,_Cycles,_1,_2>::~JustInTimeActor(&this->video_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::~_Vector_base
            (&(this->m65816_).super_ProcessorBase.super_ProcessorStorage.micro_ops_.
              super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}